

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

void htmlSkipBogusComment(htmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  
  htmlParseErr(ctxt,XML_HTML_INCORRECTLY_OPENED_COMMENT,"Incorrectly opened comment\n",
               (xmlChar *)0x0,(xmlChar *)0x0);
  do {
    xVar1 = *ctxt->input->cur;
    if (xVar1 == '\0') {
      return;
    }
    xmlNextChar(ctxt);
  } while (xVar1 != '>');
  return;
}

Assistant:

static void
htmlSkipBogusComment(htmlParserCtxtPtr ctxt) {
    int c;

    htmlParseErr(ctxt, XML_HTML_INCORRECTLY_OPENED_COMMENT,
                 "Incorrectly opened comment\n", NULL, NULL);

    do {
        c = CUR;
        if (c == 0)
            break;
        NEXT;
    } while (c != '>');
}